

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O3

void cppwinrt::write_abi_params(writer *w,method_signature *method_signature)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  TypeSig *first;
  optional<winmd::reader::TypeSig> *type;
  bool bVar2;
  pointer ppVar3;
  table_base *this;
  database *this_00;
  bool bVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint index;
  ParamSig *pPVar7;
  pointer ppVar8;
  string_view local_68;
  string_view local_50;
  method_signature *local_40;
  anon_class_8_1_89897ddb_conflict7 local_38;
  
  bVar2 = w->abi_types;
  w->abi_types = true;
  ppVar8 = (method_signature->m_params).
           super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (method_signature->m_params).
           super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 == ppVar3) {
    if (*(bool *)((long)&(method_signature->m_signature).m_ret_type.m_type.
                         super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
                         super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
                         super__Optional_payload_base<winmd::reader::TypeSig> + 0x88) == false)
    goto LAB_0011960a;
  }
  else {
    pvVar1 = &(w->super_writer_base<cppwinrt::writer>).m_first;
    bVar4 = true;
    local_40 = method_signature;
    do {
      if (bVar4) {
        bVar4 = false;
      }
      else {
        std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                  ((vector<char,std::allocator<char>> *)pvVar1,
                   (w->super_writer_base<cppwinrt::writer>).m_first.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_finish,", ","");
      }
      if ((ppVar8->second->m_type).m_is_szarray == true) {
        local_68._M_len = 0;
        local_68._M_str = (char *)0x0;
        uVar6 = winmd::reader::table_base::get_value<unsigned_short>
                          ((ppVar8->first).super_row_base<winmd::reader::Param>.m_table,
                           (ppVar8->first).super_row_base<winmd::reader::Param>.m_index,0);
        if ((uVar6 & 1) == 0) {
          pPVar7 = ppVar8->second;
          if (pPVar7->m_byref == true) {
            local_68._M_len = 0xe;
            local_68._M_str = "uint32_t*%, %*";
          }
          else {
            local_68._M_len = 0xc;
            local_68._M_str = "uint32_t%, %";
          }
        }
        else {
          local_68._M_len = 0xc;
          local_68._M_str = "uint32_t%, %";
          pPVar7 = ppVar8->second;
        }
        local_50._M_len = (size_t)ppVar8;
        local_38.args = &pPVar7->m_type;
        writer_base<cppwinrt::writer>::
        write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                  (&w->super_writer_base<cppwinrt::writer>,&local_68,
                   (anon_class_8_1_89897ddb_conflict6 *)&local_50,&local_38);
      }
      else {
        uVar6 = winmd::reader::table_base::get_value<unsigned_short>
                          ((ppVar8->first).super_row_base<winmd::reader::Param>.m_table,
                           (ppVar8->first).super_row_base<winmd::reader::Param>.m_index,0);
        pPVar7 = ppVar8->second;
        first = &pPVar7->m_type;
        if ((uVar6 & 1) == 0) {
          write_abi_arg_out(w,first);
        }
        else {
          if (*(__index_type *)
               ((long)&(pPVar7->m_type).m_type.
                       super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
               + 0x38) == '\x02') {
            local_68._M_len = 9;
            local_68._M_str = "arg_in<%>";
            writer_base<cppwinrt::writer>::write_segment<winmd::reader::TypeSig>
                      (&w->super_writer_base<cppwinrt::writer>,&local_68,first);
          }
          else {
            writer::write(w,(int)first,first,(size_t)pPVar7);
          }
          bVar5 = winmd::reader::is_const(ppVar8->second);
          if (bVar5) {
            std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                      ((vector<char,std::allocator<char>> *)pvVar1,
                       (w->super_writer_base<cppwinrt::writer>).m_first.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish," const&","");
          }
        }
      }
      if (w->param_names == true) {
        local_68._M_len = 2;
        local_68._M_str = " %";
        this = (ppVar8->first).super_row_base<winmd::reader::Param>.m_table;
        this_00 = this->m_database;
        index = winmd::reader::table_base::get_value<unsigned_int>
                          (this,(ppVar8->first).super_row_base<winmd::reader::Param>.m_index,2);
        local_50 = winmd::reader::database::get_string(this_00,index);
        writer_base<cppwinrt::writer>::
        write_segment<std::basic_string_view<char,std::char_traits<char>>>
                  (&w->super_writer_base<cppwinrt::writer>,&local_68,&local_50);
      }
      method_signature = local_40;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar3);
    if (*(bool *)((long)&(local_40->m_signature).m_ret_type.m_type.
                         super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
                         super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
                         super__Optional_payload_base<winmd::reader::TypeSig> + 0x88) == false)
    goto LAB_0011960a;
    if (!bVar4) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                ((vector<char,std::allocator<char>> *)pvVar1,
                 (w->super_writer_base<cppwinrt::writer>).m_first.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish,", ","");
    }
  }
  type = &(method_signature->m_signature).m_ret_type.m_type;
  if ((method_signature->m_signature).m_ret_type.m_type.
      super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
      super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
      super__Optional_payload_base<winmd::reader::TypeSig>._M_payload._M_value.m_is_szarray == true)
  {
    local_68._M_len = 0x16;
    local_68._M_str = "uint32_t* __%Size, %**";
    local_50 = cppwinrt::method_signature::return_param_name(method_signature);
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
              (&w->super_writer_base<cppwinrt::writer>,&local_68,&local_50,(TypeSig *)type);
  }
  else {
    write_abi_arg_out(w,(TypeSig *)type);
  }
  if (w->param_names == true) {
    local_68._M_len = 2;
    local_68._M_str = " %";
    local_50 = cppwinrt::method_signature::return_param_name(method_signature);
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>>
              (&w->super_writer_base<cppwinrt::writer>,&local_68,&local_50);
  }
LAB_0011960a:
  w->abi_types = bVar2;
  return;
}

Assistant:

static void write_abi_params(writer& w, method_signature const& method_signature)
    {
        auto abi_guard = w.push_abi_types(true);
        separator s{ w };

        for (auto&& [param, param_signature] : method_signature.params())
        {
            s();

            if (param_signature->Type().is_szarray())
            {
                std::string_view format;

                if (param.Flags().In())
                {
                    format = "uint32_t%, %";
                }
                else if (param_signature->ByRef())
                {
                    format = "uint32_t*%, %*";
                }
                else
                {
                    format = "uint32_t%, %";
                }

                w.write(format, bind<write_array_size_name>(param), bind<write_abi_arg_out>(param_signature->Type()));
            }
            else
            {
                if (param.Flags().In())
                {
                    write_abi_arg_in(w, param_signature->Type());

                    if (is_const(*param_signature))
                    {
                        w.write(" const&");
                    }
                }
                else
                {
                    write_abi_arg_out(w, param_signature->Type());
                }
            }

            if (w.param_names)
            {
                w.write(" %", param.Name());
            }
        }

        if (method_signature.return_signature())
        {
            s();

            auto const& type = method_signature.return_signature().Type();

            if (type.is_szarray())
            {
                w.write("uint32_t* __%Size, %**", method_signature.return_param_name(), type);
            }
            else
            {
                write_abi_arg_out(w, type);
            }

            if (w.param_names)
            {
                w.write(" %", method_signature.return_param_name());
            }
        }
    }